

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::ExpressionLhs<bsim::unsigned_int<3>const&>::
captureExpression<(Catch::Internal::Operator)0,bsim::unsigned_int<3>>
          (ExpressionLhs<bsim::unsigned_int<3>const&> *this,unsigned_int<3> *rhs)

{
  ResultBuilder *pRVar1;
  OfType OVar2;
  byte bVar3;
  uint uVar4;
  unsigned_int<3> *in_RDX;
  unsigned_int<3> *_value;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  bVar3 = (rhs->bits).bits[0] ^ **(byte **)(this + 8);
  OVar2 = ExpressionFailed;
  if ((bVar3 & 1) == 0) {
    uVar4 = 0xffffffff;
    do {
      if (uVar4 == 1) {
        uVar4 = 2;
        break;
      }
      uVar4 = uVar4 + 1;
    } while ((bVar3 >> ((byte)uVar4 & 0x1f) & 2) == 0);
    in_RDX = (unsigned_int<3> *)0x0;
    OVar2 = ExpressionFailed;
    if (1 < uVar4) {
      OVar2 = Ok;
    }
  }
  (pRVar1->m_data).resultType = OVar2;
  Detail::StringMakerBase<true>::convert<bsim::unsigned_int<3>>
            (&local_38,*(StringMakerBase<true> **)(this + 8),in_RDX);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  Detail::StringMakerBase<true>::convert<bsim::unsigned_int<3>>
            (&local_58,(StringMakerBase<true> *)rhs,_value);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"==","");
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }